

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DeclaratorSyntax::setChild(DeclaratorSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined4 uVar1;
  SyntaxNode *pSVar2;
  SyntaxNode *pSVar3;
  EqualsValueClauseSyntax *pEVar4;
  Token TVar5;
  
  if (index == 2) {
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      pEVar4 = (EqualsValueClauseSyntax *)0x0;
    }
    else {
      pEVar4 = (EqualsValueClauseSyntax *)TokenOrSyntax::node(&child);
    }
    this->initializer = pEVar4;
  }
  else if (index == 1) {
    pSVar2 = TokenOrSyntax::node(&child);
    uVar1 = *(undefined4 *)&pSVar2->field_0x4;
    pSVar3 = pSVar2->parent;
    (this->dimensions).super_SyntaxListBase.super_SyntaxNode.kind = pSVar2->kind;
    *(undefined4 *)&(this->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar1;
    (this->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
    (this->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar2->previewNode;
    (this->dimensions).super_SyntaxListBase.childCount = *(size_t *)(pSVar2 + 1);
    pSVar3 = pSVar2[1].previewNode;
    (this->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
    _M_ptr = (pointer)pSVar2[1].parent;
    (this->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
    _M_extent._M_extent_value = (size_t)pSVar3;
  }
  else {
    TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->name).kind = TVar5.kind;
    (this->name).field_0x2 = TVar5._2_1_;
    (this->name).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
    (this->name).rawLen = TVar5.rawLen;
    (this->name).info = TVar5.info;
  }
  return;
}

Assistant:

void DeclaratorSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.token(); return;
        case 1: dimensions = child.node()->as<SyntaxList<VariableDimensionSyntax>>(); return;
        case 2: initializer = child.node() ? &child.node()->as<EqualsValueClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}